

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
helics::ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret(data_view *block)

{
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *val;
  vector<double,_std::allocator<double>_> *data;
  
  data = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x42ba84);
  data_view::bytes((data_view *)0x42ba8e);
  helics::detail::convertFromBinary((byte *)data,in_RSI);
  return in_RDI;
}

Assistant:

static X interpret(const data_view& block)
    {
        X val;
        detail::convertFromBinary(block.bytes(), val);
        return val;
    }